

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O0

int __thiscall uttt::RandomPlayout::operator()(RandomPlayout *this,IBoard *game)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  result_type_conflict1 rVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  undefined8 *in_RSI;
  int i;
  vector<long,_std::allocator<long>_> moves;
  IMove m;
  int status;
  IBoard ngame;
  int in_stack_ffffffffffffff48;
  result_type_conflict1 in_stack_ffffffffffffff4c;
  result_type_conflict1 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  array<short,_9UL> *in_stack_ffffffffffffff58;
  IBoard *in_stack_ffffffffffffff60;
  random_device *in_stack_ffffffffffffff90;
  int local_64;
  vector<long,_std::allocator<long>_> local_60;
  long local_40;
  int local_38;
  IBoard local_34;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  if (operator()(uttt::IBoard_const&)::rd == '\0') {
    iVar3 = __cxa_guard_acquire(&operator()(uttt::IBoard_const&)::rd);
    if (iVar3 != 0) {
      std::random_device::random_device(in_stack_ffffffffffffff90);
      __cxa_atexit(std::random_device::~random_device,&operator()::rd,&__dso_handle);
      __cxa_guard_release(&operator()(uttt::IBoard_const&)::rd);
    }
  }
  if (operator()(uttt::IBoard_const&)::gen == '\0') {
    iVar3 = __cxa_guard_acquire(&operator()(uttt::IBoard_const&)::gen);
    if (iVar3 != 0) {
      std::random_device::operator()((random_device *)0x244d9b);
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::mersenne_twister_engine
                ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      __cxa_guard_release(&operator()(uttt::IBoard_const&)::gen);
    }
  }
  local_34._0_8_ = *local_10;
  local_34.micro._M_elems._4_8_ = local_10[1];
  local_34._16_8_ = local_10[2];
  local_38 = IBoard::GetStatus(&local_34);
  while (local_38 == -1) {
    local_40 = 0xffffffffffffffff;
    if (local_34.next < '\0') {
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)0x244f37);
      for (local_64 = 0; local_64 < 9; local_64 = local_64 + 1) {
        std::array<short,_9UL>::operator[]
                  ((array<short,_9UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        bVar2 = std::vector<char,_std::allocator<char>_>::empty
                          ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff60);
        if (!bVar2) {
          in_stack_ffffffffffffff54 = local_64 * 9;
          in_stack_ffffffffffffff58 = &local_34.micro;
          pvVar5 = std::array<short,_9UL>::operator[]
                             ((array<short,_9UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          in_stack_ffffffffffffff60 = (IBoard *)(g_moves + *pvVar5);
          pvVar5 = std::array<short,_9UL>::operator[]
                             ((array<short,_9UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          std::vector<char,_std::allocator<char>_>::size(g_moves + *pvVar5);
          std::uniform_int_distribution<int>::uniform_int_distribution
                    ((uniform_int_distribution<int> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
          in_stack_ffffffffffffff50 =
               std::uniform_int_distribution<int>::operator()
                         ((uniform_int_distribution<int> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                           *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          std::vector<char,_std::allocator<char>_>::operator[]
                    ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff60,
                     (long)in_stack_ffffffffffffff50);
          std::vector<long,_std::allocator<long>_>::push_back
                    ((vector<long,_std::allocator<long>_> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (value_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        }
      }
      std::vector<long,_std::allocator<long>_>::size(&local_60);
      std::uniform_int_distribution<int>::uniform_int_distribution
                ((uniform_int_distribution<int> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff4c =
           std::uniform_int_distribution<int>::operator()
                     ((uniform_int_distribution<int> *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                       *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                         (&local_60,(long)in_stack_ffffffffffffff4c);
      local_40 = *pvVar7;
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff60);
    }
    else {
      iVar3 = (int)local_34.next;
      pvVar5 = std::array<short,_9UL>::operator[]
                         ((array<short,_9UL> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      sVar1 = *pvVar5;
      pvVar5 = std::array<short,_9UL>::operator[]
                         ((array<short,_9UL> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      std::vector<char,_std::allocator<char>_>::size(g_moves + *pvVar5);
      std::uniform_int_distribution<int>::uniform_int_distribution
                ((uniform_int_distribution<int> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      rVar4 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pvVar6 = std::vector<char,_std::allocator<char>_>::operator[](g_moves + sVar1,(long)rVar4);
      local_40 = (long)(iVar3 * 9 + (int)*pvVar6);
    }
    IBoard::ApplyMove(in_stack_ffffffffffffff60,(IMove *)in_stack_ffffffffffffff58);
    local_38 = IBoard::GetStatus(&local_34);
  }
  return local_38;
}

Assistant:

int
RandomPlayout::operator()(const uttt::IBoard &game) const
{
    static std::random_device rd;
    static std::mt19937 gen(rd());

    auto ngame(game);
    int status = ngame.GetStatus();
    while (status == game::Undecided)
    {
        game::IMove m = -1;
        if (ngame.next >= 0)
            m = ngame.next * 9 + g_moves[ngame.micro[ngame.next]][std::uniform_int_distribution<>(0, g_moves[ngame.micro[ngame.next]].size() - 1)(gen)];
        else
        {
            std::vector<game::IMove> moves;
            for (int i = 0; i < 9; i++)
                if (!g_moves[ngame.micro[i]].empty())
                    moves.push_back(i * 9 + g_moves[ngame.micro[i]][std::uniform_int_distribution<>(0, g_moves[ngame.micro[i]].size() - 1)(gen)]);
            m = moves[std::uniform_int_distribution<>(0, moves.size() - 1)(gen)];
        }
        ngame.ApplyMove(m);
        status = ngame.GetStatus();
    }
    return status;
}